

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Deserializer.cpp
# Opt level: O2

void __thiscall
adios2::format::BP3Deserializer::ParseMetadata
          (BP3Deserializer *this,BufferSTL *bufferSTL,Engine *engine)

{
  char *pcVar1;
  allocator local_41;
  string local_40;
  
  ParseMinifooter(this,bufferSTL);
  pcVar1 = "Fortran";
  if (engine->m_IO->m_ArrayOrder == RowMajor) {
    pcVar1 = "C++";
  }
  std::__cxx11::string::string((string *)&local_40,pcVar1,&local_41);
  ParsePGIndex(this,bufferSTL,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  ParseVariablesIndex(this,bufferSTL,engine);
  ParseAttributesIndex(this,bufferSTL,engine);
  return;
}

Assistant:

void BP3Deserializer::ParseMetadata(const BufferSTL &bufferSTL, core::Engine &engine)

{
    ParseMinifooter(bufferSTL);
    ParsePGIndex(bufferSTL,
                 (engine.m_IO.m_ArrayOrder == ArrayOrdering::RowMajor) ? "C++" : "Fortran");
    ParseVariablesIndex(bufferSTL, engine);
    ParseAttributesIndex(bufferSTL, engine);
}